

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void create_file_names(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_18;
  char *tmpdir;
  int len;
  int i;
  
  local_18 = getenv("TMPDIR");
  if (local_18 == (char *)0x0) {
    local_18 = "/tmp";
  }
  sVar2 = strlen(local_18);
  tmpdir._0_4_ = (int)sVar2;
  tmpdir._4_4_ = (int)tmpdir + 0xd;
  if (((int)tmpdir != 0) && (local_18[(int)tmpdir + -1] != '/')) {
    tmpdir._4_4_ = (int)tmpdir + 0xe;
  }
  action_file_name = (char *)malloc((ulong)tmpdir._4_4_);
  if (action_file_name == (char *)0x0) {
    no_space();
  }
  text_file_name = (char *)malloc((ulong)tmpdir._4_4_);
  if (text_file_name == (char *)0x0) {
    no_space();
  }
  union_file_name = (char *)malloc((ulong)tmpdir._4_4_);
  if (union_file_name == (char *)0x0) {
    no_space();
  }
  strcpy(action_file_name,local_18);
  strcpy(text_file_name,local_18);
  strcpy(union_file_name,local_18);
  if (((int)tmpdir != 0) && (local_18[(int)tmpdir + -1] != '/')) {
    action_file_name[(int)tmpdir] = '/';
    text_file_name[(int)tmpdir] = '/';
    union_file_name[(int)tmpdir] = '/';
    tmpdir._0_4_ = (int)tmpdir + 1;
  }
  strcpy(action_file_name + (int)tmpdir,temp_form);
  strcpy(text_file_name + (int)tmpdir,temp_form);
  strcpy(union_file_name + (int)tmpdir,temp_form);
  action_file_name[(int)tmpdir + 5] = 'a';
  text_file_name[(int)tmpdir + 5] = 't';
  union_file_name[(int)tmpdir + 5] = 'u';
  pcVar3 = mktemp(action_file_name);
  if (pcVar3 == (char *)0x0) {
    fprintf(_stderr,"btyacc: Cannot create temporary file\n");
    exit(1);
  }
  pcVar3 = mktemp(text_file_name);
  if (pcVar3 == (char *)0x0) {
    fprintf(_stderr,"btyacc: Cannot create temporary file\n");
    exit(1);
  }
  pcVar3 = mktemp(union_file_name);
  if (pcVar3 == (char *)0x0) {
    fprintf(_stderr,"btyacc: Cannot create temporary file\n");
    exit(1);
  }
  sVar2 = strlen(file_prefix);
  iVar1 = (int)sVar2;
  output_file_name = (char *)malloc((ulong)(iVar1 + 7));
  if (output_file_name == (char *)0x0) {
    no_space();
  }
  strcpy(output_file_name,file_prefix);
  strcpy(output_file_name + iVar1,".tab.c");
  if (rflag == '\0') {
    code_file_name = output_file_name;
  }
  else {
    code_file_name = (char *)malloc((ulong)(iVar1 + 8));
    if (code_file_name == (char *)0x0) {
      no_space();
    }
    strcpy(code_file_name,file_prefix);
    strcpy(code_file_name + iVar1,".code.c");
  }
  if (dflag != '\0') {
    defines_file_name = (char *)malloc((ulong)(iVar1 + 7));
    if (defines_file_name == (char *)0x0) {
      no_space();
    }
    strcpy(defines_file_name,file_prefix);
    strcpy(defines_file_name + iVar1,".tab.h");
  }
  if (ebnfflag != '\0') {
    ebnf_file_name = (char *)malloc((ulong)(iVar1 + 8));
    if (ebnf_file_name == (char *)0x0) {
      no_space();
    }
    strcpy(ebnf_file_name,file_prefix);
    strcpy(ebnf_file_name + iVar1,".ebnf");
  }
  if (vflag != '\0') {
    verbose_file_name = (char *)malloc((ulong)(iVar1 + 8));
    if (verbose_file_name == (char *)0x0) {
      no_space();
    }
    strcpy(verbose_file_name,file_prefix);
    strcpy(verbose_file_name + iVar1,".output");
  }
  return;
}

Assistant:

void create_file_names()
{
    int i, len;
    char *tmpdir;

    tmpdir = getenv("TMPDIR");
    if (tmpdir == 0) tmpdir = DEFAULT_TMPDIR;

    len = strlen(tmpdir);
    i = len + 13;
    if (len && tmpdir[len-1] != DIR_CHAR)
	++i;

    action_file_name = MALLOC(i);
    if (action_file_name == 0) no_space();
    text_file_name = MALLOC(i);
    if (text_file_name == 0) no_space();
    union_file_name = MALLOC(i);
    if (union_file_name == 0) no_space();

    strcpy(action_file_name, tmpdir);
    strcpy(text_file_name, tmpdir);
    strcpy(union_file_name, tmpdir);

    if (len && tmpdir[len - 1] != DIR_CHAR)
    {
	action_file_name[len] = DIR_CHAR;
	text_file_name[len] = DIR_CHAR;
	union_file_name[len] = DIR_CHAR;
	++len;
    }

    strcpy(action_file_name + len, temp_form);
    strcpy(text_file_name + len, temp_form);
    strcpy(union_file_name + len, temp_form);

    action_file_name[len + 5] = 'a';
    text_file_name[len + 5] = 't';
    union_file_name[len + 5] = 'u';

    if(mktemp(action_file_name)==NULL) {
      fprintf(stderr, "btyacc: Cannot create temporary file\n");
      exit(1);
    }
    if(mktemp(text_file_name)==NULL) {
      fprintf(stderr, "btyacc: Cannot create temporary file\n");
      exit(1);
    }
    if(mktemp(union_file_name)==NULL) {
      fprintf(stderr, "btyacc: Cannot create temporary file\n");
      exit(1);
    }

    len = strlen(file_prefix);

    output_file_name = MALLOC(len + 7);
    if (output_file_name == 0)
	no_space();
    strcpy(output_file_name, file_prefix);
    strcpy(output_file_name + len, OUTPUT_SUFFIX);

    if (rflag)
    {
	code_file_name = MALLOC(len + 8);
	if (code_file_name == 0)
	    no_space();
	strcpy(code_file_name, file_prefix);
	strcpy(code_file_name + len, CODE_SUFFIX);
    }
    else
	code_file_name = output_file_name;

    if (dflag)
    {
	defines_file_name = MALLOC(len + 7);
	if (defines_file_name == 0)
	    no_space();
	strcpy(defines_file_name, file_prefix);
	strcpy(defines_file_name + len, DEFINES_SUFFIX);
    }

    if (ebnfflag)
    {
	ebnf_file_name = MALLOC(len + 8);
	if (ebnf_file_name == 0)
	    no_space();
	strcpy(ebnf_file_name, file_prefix);
	strcpy(ebnf_file_name + len, EBNF_SUFFIX);
    }

    if (vflag)
    {
	verbose_file_name = MALLOC(len + 8);
	if (verbose_file_name == 0)
	    no_space();
	strcpy(verbose_file_name, file_prefix);
	strcpy(verbose_file_name + len, VERBOSE_SUFFIX);
    }
}